

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::addKernelInfo(CLIntercept *this,cl_kernel kernel,cl_program program,string *kernelName)

{
  uint64_t uVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  string demangledName;
  cl_kernel local_58;
  string local_50;
  cl_program local_30;
  
  local_58 = kernel;
  local_30 = program;
  std::mutex::lock(&this->m_Mutex);
  pmVar2 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[](&this->m_ProgramInfoMap,&local_30);
  pmVar3 = std::
           map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
           ::operator[](&this->m_KernelInfoMap,&local_58);
  if ((this->m_Config).DemangleKernelNames == true) {
    demangle(&local_50,kernelName);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)kernelName);
  }
  std::__cxx11::string::_M_assign((string *)pmVar3);
  uVar1 = pmVar2->OptionsHash;
  pmVar3->ProgramHash = pmVar2->ProgramHash;
  pmVar3->OptionsHash = uVar1;
  pmVar3->ProgramNumber = pmVar2->ProgramNumber;
  pmVar3->CompileCount = pmVar2->CompileCount - 1;
  addShortKernelName(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::addKernelInfo(
    const cl_kernel kernel,
    const cl_program program,
    const std::string& kernelName )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    SKernelInfo& kernelInfo = m_KernelInfoMap[ kernel ];
    std::string demangledName = config().DemangleKernelNames ?
        demangle(kernelName) :
        kernelName;

    kernelInfo.KernelName = demangledName;

    kernelInfo.ProgramHash = programInfo.ProgramHash;
    kernelInfo.OptionsHash = programInfo.OptionsHash;

    kernelInfo.ProgramNumber = programInfo.ProgramNumber;
    kernelInfo.CompileCount = programInfo.CompileCount - 1;

    addShortKernelName( demangledName );
}